

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_bspline_bundle_on_tec
          (REF_GEOM ref_geom,REF_INT degree,REF_INT n_control_point,REF_DBL *bundle,REF_INT faceid,
          char *filename)

{
  size_t __size;
  REF_STATUS RVar1;
  uint uVar2;
  FILE *__s;
  REF_DBL *control_points;
  REF_DBL *control_points_00;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  double t;
  REF_DBL uv [2];
  REF_DBL xyz [3];
  REF_DBL local_78;
  REF_DBL local_70 [2];
  double local_60;
  double local_58;
  REF_GEOM local_50;
  REF_DBL local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_50 = ref_geom;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar5 = "unable to open file";
    uVar4 = 0x1180;
  }
  else {
    fwrite("title=\"refine bspine bundle\"\n",0x1d,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"u\" \"v\" \"t\"\n",0x24,1,__s);
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1185
             ,"ref_geom_bspline_bundle_on_tec","malloc u of REF_DBL negative");
      return 1;
    }
    __size = (ulong)(uint)n_control_point * 8;
    control_points = (REF_DBL *)malloc(__size);
    if (control_points == (REF_DBL *)0x0) {
      pcVar5 = "malloc u of REF_DBL NULL";
      uVar4 = 0x1185;
    }
    else {
      control_points_00 = (REF_DBL *)malloc(__size);
      if (control_points_00 != (REF_DBL *)0x0) {
        uVar7 = (ulong)(degree + n_control_point);
        if (n_control_point != 0) {
          lVar3 = 0;
          do {
            *(undefined8 *)((long)control_points + lVar3) =
                 *(undefined8 *)((long)bundle + lVar3 * 2 + uVar7 * 8 + 8);
            *(undefined8 *)((long)control_points_00 + lVar3) =
                 *(undefined8 *)((long)bundle + lVar3 * 2 + uVar7 * 8 + 0x10);
            lVar3 = lVar3 + 8;
          } while ((ulong)(uint)n_control_point << 3 != lVar3);
        }
        fprintf(__s,"zone t=\"bundle\", i=%d, datapacking=%s\n",0x3e9,"point");
        local_58 = *bundle;
        local_60 = bundle[uVar7];
        iVar6 = 0;
        while( true ) {
          t = ((double)iVar6 / 1000.0) * local_60 + (1.0 - (double)iVar6 / 1000.0) * local_58;
          RVar1 = ref_geom_bspline_eval(degree,n_control_point,bundle,t,control_points,&local_78);
          if (RVar1 != 0) {
            uVar7 = 1;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1195,"ref_geom_bspline_bundle_on_tec",1);
          }
          if (RVar1 != 0) {
            return (REF_STATUS)uVar7;
          }
          RVar1 = ref_geom_bspline_eval(degree,n_control_point,bundle,t,control_points_00,local_70);
          if (RVar1 != 0) {
            uVar7 = 1;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1197,"ref_geom_bspline_bundle_on_tec",1);
          }
          if (RVar1 != 0) break;
          uVar2 = ref_egads_eval_at(local_50,2,faceid,&local_78,&local_48,(REF_DBL *)0x0);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x1199,"ref_geom_bspline_bundle_on_tec",(ulong)uVar2);
            uVar7 = (ulong)uVar2;
          }
          if (uVar2 != 0) {
            return (REF_STATUS)uVar7;
          }
          fprintf(__s,"%f %f %f %f %f %f\n",local_48,local_40,local_38,local_78,local_70[0],t);
          iVar6 = iVar6 + 1;
          if (iVar6 == 0x3e9) {
            free(control_points_00);
            free(control_points);
            fclose(__s);
            return 0;
          }
        }
        return (REF_STATUS)uVar7;
      }
      pcVar5 = "malloc v of REF_DBL NULL";
      uVar4 = 0x1186;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_bspline_bundle_on_tec",pcVar5);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_bundle_on_tec(
    REF_GEOM ref_geom, REF_INT degree, REF_INT n_control_point, REF_DBL *bundle,
    REF_INT faceid, const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *u, *v, uv[2], *knots, xyz[3];
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine bundle\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\" \"u\" \"v\" \"t\"\n");

  ref_malloc(u, n_control_point, REF_DBL);
  ref_malloc(v, n_control_point, REF_DBL);
  knots = bundle;
  for (i = 0; i < n_control_point; i++) {
    u[i] = bundle[nknot + 0 + 2 * i];
    v[i] = bundle[nknot + 1 + 2 * i];
  }

  fprintf(file, "zone t=\"bundle\", i=%d, datapacking=%s\n", n, "point");
  t0 = knots[0];
  t1 = knots[nknot - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, u, &(uv[0])),
        "eval");
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, v, &(uv[1])),
        "eval");
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, faceid, uv, xyz, NULL),
        "eval face");
    fprintf(file, "%f %f %f %f %f %f\n", xyz[0], xyz[1], xyz[2], uv[0], uv[1],
            t);
  }
  ref_free(v);
  ref_free(u);
  fclose(file);
  return REF_SUCCESS;
}